

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::CheckOpcode1(TypeChecker *this,Opcode opcode,Limits *limits)

{
  Result RVar1;
  Opcode local_74;
  Info local_70;
  
  local_74.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_70,&local_74);
  if ((limits != (Limits *)0x0) &&
     (local_70.param_types[0].enum_ = I32, local_70.param_types[0].type_index_ = 0,
     limits->is_64 != false)) {
    local_70.param_types[0].enum_ = I64;
    local_70.param_types[0].type_index_ = 0;
  }
  Opcode::GetInfo(&local_70,&local_74);
  RVar1 = PopAndCheck1Type(this,local_70.param_types[0],local_70.name);
  Opcode::GetInfo(&local_70,&local_74);
  PushType(this,local_70.result_type);
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode1(Opcode opcode, const Limits* limits) {
  Result result = PopAndCheck1Type(
      GetMemoryParam(opcode.GetParamType1(), limits), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}